

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Solver *this;
  allocator local_31;
  string local_30;
  
  this = (Solver *)operator_new(0x20);
  std::__cxx11::string::string((string *)&local_30,"data/area_names/area_names_small.txt",&local_31)
  ;
  Solver::Solver(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int main()
{
//	Solver *solver = new Solver("data/disease_names/disease_names.txt");
//	Solver *solver = new Solver("data/dept_names/dept_names.txt");
//	Solver *solver = new Solver("data/course_names/course_names.txt");
	Solver *solver = new Solver("data/area_names/area_names_small.txt");

//	Exp::preprocess();
//	Exp::varyDictionary();
//	Exp::varyThreshold();
//	Exp::varyMeasure();
//	Exp::calculateMeasurePRF();
//	Exp::calculateDictPRF();
//	Exp::check();
//	Exp::check2();
//	Exp::genDirty();
//	Exp::dictionary_scale();
//	Exp::joinalgo_scale();
//	Exp::show_datasets();
//	Exp::testRuleCompression();
//	Exp::genSubset()
//	Exp::genDBData(1);
	return 0;
}